

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O0

quaternion operator*(quaternion *in_quat1,quaternion *in_quat2)

{
  quaternion qVar1;
  quaternion *in_quat2_local;
  quaternion *in_quat1_local;
  quaternion temp;
  
  qVar1.field_1.dual.x =
       ((in_quat1->field_1).dual.y * (in_quat2->field_1).dual.z +
       (in_quat1->field_0).w * (in_quat2->field_1).dual.x +
       (in_quat1->field_1).dual.x * (in_quat2->field_0).w) -
       (in_quat1->field_1).dual.z * (in_quat2->field_1).dual.y;
  qVar1.field_0.w =
       (((in_quat1->field_0).w * (in_quat2->field_0).w -
        (in_quat1->field_1).dual.x * (in_quat2->field_1).dual.x) -
       (in_quat1->field_1).dual.y * (in_quat2->field_1).dual.y) -
       (in_quat1->field_1).dual.z * (in_quat2->field_1).dual.z;
  qVar1.field_1.dual.y =
       (in_quat1->field_1).dual.z * (in_quat2->field_1).dual.x +
       (in_quat1->field_1).dual.y * (in_quat2->field_0).w +
       ((in_quat1->field_0).w * (in_quat2->field_1).dual.y -
       (in_quat1->field_1).dual.x * (in_quat2->field_1).dual.z);
  qVar1.field_1.dual.z =
       (in_quat1->field_1).dual.z * (in_quat2->field_0).w +
       (((in_quat1->field_0).w * (in_quat2->field_1).dual.z +
        (in_quat1->field_1).dual.x * (in_quat2->field_1).dual.y) -
       (in_quat1->field_1).dual.y * (in_quat2->field_1).dual.x);
  return qVar1;
}

Assistant:

quaternion operator*(const quaternion &in_quat1, const quaternion &in_quat2) {
    quaternion temp = {0.f};

    temp.w = in_quat1.w * in_quat2.w - in_quat1.q1 * in_quat2.q1 -
             in_quat1.q2 * in_quat2.q2 - in_quat1.q3 * in_quat2.q3;
    temp.q1 = in_quat1.w * in_quat2.q1 + in_quat1.q1 * in_quat2.w +
              in_quat1.q2 * in_quat2.q3 - in_quat1.q3 * in_quat2.q2;
    temp.q2 = in_quat1.w * in_quat2.q2 - in_quat1.q1 * in_quat2.q3 +
              in_quat1.q2 * in_quat2.w + in_quat1.q3 * in_quat2.q1;
    temp.q3 = in_quat1.w * in_quat2.q3 + in_quat1.q1 * in_quat2.q2 -
              in_quat1.q2 * in_quat2.q1 + in_quat1.q3 * in_quat2.w;

    return temp;
}